

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O0

UResourceBundle *
ures_findSubResource_63(UResourceBundle *resB,char *path,UResourceBundle *fillIn,UErrorCode *status)

{
  UBool UVar1;
  char *local_48;
  char *key;
  UResourceBundle *result;
  UErrorCode *pUStack_30;
  Resource res;
  UErrorCode *status_local;
  UResourceBundle *fillIn_local;
  char *path_local;
  UResourceBundle *resB_local;
  
  result._4_4_ = 0xffffffff;
  key = (char *)fillIn;
  if ((status == (UErrorCode *)0x0) ||
     (pUStack_30 = status, status_local = (UErrorCode *)fillIn,
     fillIn_local = (UResourceBundle *)path, path_local = (char *)resB, UVar1 = U_FAILURE(*status),
     UVar1 != '\0')) {
    resB_local = (UResourceBundle *)key;
  }
  else {
    do {
      result._4_4_ = res_findResource_63((ResourceData *)(path_local + 0x28),
                                         *(Resource *)(path_local + 0xac),(char **)&fillIn_local,
                                         &local_48);
      if (result._4_4_ == 0xffffffff) {
        *pUStack_30 = U_MISSING_RESOURCE_ERROR;
        break;
      }
      key = (char *)init_resb_result((ResourceData *)(path_local + 0x28),result._4_4_,local_48,-1,
                                     *(UResourceDataEntry **)(path_local + 8),
                                     (UResourceBundle *)path_local,0,(UResourceBundle *)status_local
                                     ,pUStack_30);
      path_local = key;
    } while (*(char *)&fillIn_local->fKey != '\0');
    resB_local = (UResourceBundle *)key;
  }
  return resB_local;
}

Assistant:

U_CAPI UResourceBundle* U_EXPORT2
ures_findSubResource(const UResourceBundle *resB, char* path, UResourceBundle *fillIn, UErrorCode *status) 
{
  Resource res = RES_BOGUS;
  UResourceBundle *result = fillIn;
  const char *key;

  if(status == NULL || U_FAILURE(*status)) {
    return result;
  }

  /* here we do looping and circular alias checking */
  /* this loop is here because aliasing is resolved on this level, not on res level */
  /* so, when we encounter an alias, it is not an aggregate resource, so we return */
  do {
    res = res_findResource(&(resB->fResData), resB->fRes, &path, &key); 
    if(res != RES_BOGUS) {
        result = init_resb_result(&(resB->fResData), res, key, -1, resB->fData, resB, 0, fillIn, status);
        resB = result;
    } else {
        *status = U_MISSING_RESOURCE_ERROR;
        break;
    }
  } while(*path); /* there is more stuff in the path */

  return result;
}